

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O1

void __thiscall
burst::
merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
::remove_empty_ranges
          (merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
           *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *local_10;
  
  local_50 = (this->m_begin).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_48 = (this->m_begin).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  local_40 = (this->m_begin).m_iterator._M_current;
  local_20 = (this->m_end).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_18 = (this->m_end).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  local_10 = (this->m_end).m_iterator._M_current;
  std::
  remove_if<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,std::allocator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>>>,burst::merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,std::allocator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>>>,std::less<void>>::remove_empty_ranges()::_lambda(auto:1_const&)_1_>
            (&local_38,&local_50);
  p_Var2 = p_Stack_30;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_end).m_container.
            super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_end).m_container.
  super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (this->m_end).m_container.
  super___shared_ptr<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->m_end).m_iterator._M_current = local_28;
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

void remove_empty_ranges ()
        {
            m_end = std::remove_if(m_begin, m_end, [] (const auto & r) {return r.empty();});
        }